

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage1Runner.hpp
# Opt level: O3

void __thiscall Centaurus::Stage1Runner::signal_exit(Stage1Runner *this)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  
  pvVar2 = (this->super_BaseRunner).m_sub_window;
  uVar5 = (ulong)(uint)(this->super_BaseRunner).m_bank_num;
  do {
    if ((int)uVar5 < 1) {
      return;
    }
    lVar3 = 0;
    iVar4 = 0;
    do {
      iVar1 = (this->super_BaseRunner).m_bank_num;
      uVar5 = (ulong)iVar1;
      iVar4 = (iVar4 + 1) - (uint)(*(int *)((long)pvVar2 + lVar3 * 8 + 4) == 0);
      lVar3 = lVar3 + 1;
    } while (lVar3 < (long)uVar5);
  } while (iVar4 != 0);
  if (0 < iVar1) {
    lVar3 = 0;
    do {
      LOCK();
      *(undefined4 *)((long)pvVar2 + lVar3 * 8 + 4) = 6;
      UNLOCK();
      sem_post((sem_t *)(this->super_BaseRunner).m_slave_lock);
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->super_BaseRunner).m_bank_num);
  }
  return;
}

Assistant:

void signal_exit()
  {
    WindowBankEntry *banks = (WindowBankEntry *)m_sub_window;
    while (true) {
      int count = 0;
      for (int i = 0; i < m_bank_num; i++) {
        WindowBankState state = banks[i].state.load();
        if (state != WindowBankState::Free)
          count++;
      }
      if (count == 0) break;
    }
    for (int i = 0; i < m_bank_num; i++) {
      banks[i].state.store(WindowBankState::YouAreDone);
      release_semaphore();
    }
  }